

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signals.cpp
# Opt level: O0

void insertSignalHandler(SignalHandlerCallback FnPtr,void *Cookie)

{
  bool bVar1;
  Status local_2c;
  Status Desired;
  Status Expected;
  CallbackAndCookie *SetMe;
  size_t I;
  void *Cookie_local;
  SignalHandlerCallback FnPtr_local;
  
  SetMe = (CallbackAndCookie *)0x0;
  I = (size_t)Cookie;
  Cookie_local = FnPtr;
  while( true ) {
    if ((CallbackAndCookie *)0x7 < SetMe) {
      llvm::report_fatal_error("too many signal callbacks already registered",true);
    }
    _Desired = CallBacksToRun + (long)SetMe;
    local_2c = Empty;
    bVar1 = std::atomic<CallbackAndCookie::Status>::compare_exchange_strong
                      (&CallBacksToRun[(long)SetMe].Flag,&local_2c,Initializing,memory_order_seq_cst
                      );
    if (bVar1) break;
    SetMe = (CallbackAndCookie *)((long)&SetMe->Callback + 1);
  }
  _Desired->Callback = (SignalHandlerCallback)Cookie_local;
  _Desired->Cookie = (void *)I;
  std::atomic<CallbackAndCookie::Status>::store(&_Desired->Flag,Initialized,memory_order_seq_cst);
  return;
}

Assistant:

static void insertSignalHandler(sys::SignalHandlerCallback FnPtr,
                                void *Cookie) {
  for (size_t I = 0; I < MaxSignalHandlerCallbacks; ++I) {
    auto &SetMe = CallBacksToRun[I];
    auto Expected = CallbackAndCookie::Status::Empty;
    auto Desired = CallbackAndCookie::Status::Initializing;
    if (!SetMe.Flag.compare_exchange_strong(Expected, Desired))
      continue;
    SetMe.Callback = FnPtr;
    SetMe.Cookie = Cookie;
    SetMe.Flag.store(CallbackAndCookie::Status::Initialized);
    return;
  }
  report_fatal_error("too many signal callbacks already registered");
}